

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

void * metacallfms(void *func,char *buffer,size_t size,void *allocator)

{
  type_id tVar1;
  type_id tVar2;
  int iVar3;
  signature s_00;
  size_t sVar4;
  function_return pvVar5;
  type ptVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  value pvVar10;
  long in_RDX;
  long in_RSI;
  function_conflict in_RDI;
  value cast_ret_1;
  type_id id_1;
  type t_1;
  value *v_element;
  value element;
  size_t args_count;
  size_t iterator;
  value v;
  value ret_1;
  value *v_map;
  void *values [16];
  void *keys [16];
  value cast_ret;
  type_id id;
  type t;
  value ret;
  signature s;
  function f;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  void **in_stack_fffffffffffffe40;
  function_conflict in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  ulong local_178;
  function_return local_168;
  undefined8 local_158;
  undefined4 in_stack_fffffffffffffeb0;
  type_id in_stack_fffffffffffffeb4;
  value in_stack_fffffffffffffeb8;
  value in_stack_fffffffffffffec8;
  undefined8 local_d8 [4];
  void **in_stack_ffffffffffffff48;
  void **in_stack_ffffffffffffff50;
  void *in_stack_ffffffffffffff58;
  function_return local_8;
  
  if (in_RDI == (function_conflict)0x0) {
    local_8 = (function_return)0x0;
  }
  else {
    s_00 = function_signature(in_RDI);
    if ((in_RSI == 0) || (in_RDX == 0)) {
      sVar4 = signature_count(s_00);
      if (sVar4 == 0) {
        pvVar5 = function_call(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                               CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        local_8 = pvVar5;
        if ((pvVar5 != (function_return)0x0) &&
           (ptVar6 = signature_get_return(s_00), ptVar6 != (type)0x0)) {
          tVar1 = type_index(ptVar6);
          tVar2 = value_type_id((value)CONCAT44(tVar1,in_stack_fffffffffffffe50));
          if ((tVar1 != tVar2) &&
             (local_8 = value_type_cast(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4),
             local_8 == (value)0x0)) {
            local_8 = pvVar5;
          }
        }
      }
      else {
        local_8 = (function_return)0x0;
      }
    }
    else {
      metacall_serial();
      pvVar7 = metacall_deserialize
                         ((char *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          (char *)in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40,
                          (void *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      if (pvVar7 == (void *)0x0) {
        local_8 = (function_return)0x0;
      }
      else {
        tVar1 = value_type_id((value)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        iVar3 = type_id_map(tVar1);
        if (iVar3 == 0) {
          sVar8 = signature_count(s_00);
          sVar4 = sVar8;
          sVar9 = value_type_count((void *)CONCAT44(in_stack_fffffffffffffe3c,
                                                    in_stack_fffffffffffffe38));
          if (sVar4 == sVar9) {
            value_to_map((value)0x138340);
            for (local_178 = 0; local_178 < sVar8; local_178 = local_178 + 1) {
              value_to_array((value)0x138377);
              pvVar10 = value_type_copy(in_stack_fffffffffffffec8);
              local_d8[local_178] = pvVar10;
              pvVar10 = value_type_copy(in_stack_fffffffffffffec8);
              (&local_158)[local_178] = pvVar10;
            }
            local_168 = metacallfmv(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                    in_stack_ffffffffffffff48);
            for (local_178 = 0; local_178 < sVar8; local_178 = local_178 + 1) {
              value_type_destroy((value)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0
                                                ));
              value_type_destroy((value)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0
                                                ));
            }
            value_type_destroy((value)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
            ;
            if ((local_168 != (void *)0x0) &&
               (ptVar6 = signature_get_return(s_00), ptVar6 != (type)0x0)) {
              tVar1 = type_index(ptVar6);
              tVar2 = value_type_id((value)CONCAT44(in_stack_fffffffffffffe54,
                                                    in_stack_fffffffffffffe50));
              if ((tVar1 != tVar2) &&
                 (pvVar10 = value_type_cast(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4),
                 pvVar10 != (value)0x0)) {
                local_168 = pvVar10;
              }
            }
            local_8 = local_168;
          }
          else {
            value_type_destroy((value)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0))
            ;
            local_8 = (function_return)0x0;
          }
        }
        else {
          value_type_destroy((value)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          local_8 = (function_return)0x0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

void *metacallfms(void *func, const char *buffer, size_t size, void *allocator)
{
	function f = (function)func;

	if (f != NULL)
	{
		signature s = function_signature(f);

		if (buffer == NULL || size == 0)
		{
			if (signature_count(s) == 0)
			{
				value ret = function_call(f, metacall_null_args, 0);

				if (ret != NULL)
				{
					type t = signature_get_return(s);

					if (t != NULL)
					{
						type_id id = type_index(t);

						if (id != value_type_id(ret))
						{
							value cast_ret = value_type_cast(ret, id);

							return (cast_ret == NULL) ? ret : cast_ret;
						}
					}
				}

				return ret;
			}

			return NULL;
		}
		else
		{
			void *keys[METACALL_ARGS_SIZE];
			void *values[METACALL_ARGS_SIZE];

			value *v_map, ret, v = (value)metacall_deserialize(metacall_serial(), buffer, size, allocator);

			size_t iterator, args_count;

			if (v == NULL)
			{
				return NULL;
			}

			if (type_id_map(value_type_id(v)) != 0)
			{
				value_type_destroy(v);
				return NULL;
			}

			args_count = signature_count(s);

			/* TODO: No optional arguments allowed, review in the future */
			if (args_count != value_type_count(v))
			{
				value_type_destroy(v);
				return NULL;
			}

			v_map = value_to_map(v);

			for (iterator = 0; iterator < args_count; ++iterator)
			{
				value element = v_map[iterator];
				value *v_element = value_to_array(element);

				/* This step is necessary in order to handle type castings */
				keys[iterator] = value_type_copy(v_element[0]);
				values[iterator] = value_type_copy(v_element[1]);
			}

			ret = metacallfmv(f, keys, values);

			/* This step is necessary in order to handle type castings (otherwise it generates leaks) */
			for (iterator = 0; iterator < args_count; ++iterator)
			{
				value_type_destroy(keys[iterator]);
				value_type_destroy(values[iterator]);
			}

			value_type_destroy(v);

			if (ret != NULL)
			{
				type t = signature_get_return(s);

				if (t != NULL)
				{
					type_id id = type_index(t);

					if (id != value_type_id(ret))
					{
						value cast_ret = value_type_cast(ret, id);

						if (cast_ret != NULL)
						{
							ret = cast_ret;
						}
					}
				}
			}

			return ret;
		}
	}

	return NULL;
}